

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

double gl4cts::Math::roundEven<double>(double t)

{
  GLdouble GVar1;
  double local_20;
  double res;
  double frac;
  double t_local;
  
  GVar1 = fract(t);
  local_20 = t - GVar1;
  if (GVar1 <= 0.5) {
    if (((GVar1 == 0.5) && (!NAN(GVar1))) && ((int)local_20 % 2 != 0)) {
      local_20 = local_20 + 1.0;
    }
  }
  else {
    local_20 = local_20 + 1.0;
  }
  return local_20;
}

Assistant:

static T roundEven(T t)
{
	T frac = fract(t);
	T res  = t - frac;

	if (((T)0.5) < frac)
	{
		res += ((T)1.0);
	}
	else if ((((T)0.5) == frac) && (0 != ((int)res) % 2))
	{
		res += ((T)1.0);
	}

	return res;
}